

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataCollection::CollectionWithinCollectionComputeHeapSizes
               (Vector *heap_sizes_v,Vector *source_v,TupleDataVectorFormat *source_format,
               SelectionVector *append_sel,idx_t append_count,UnifiedVectorFormat *list_data)

{
  ValidityMask *this;
  ulong *puVar1;
  ValidityMask *this_00;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  undefined8 uVar5;
  byte bVar6;
  sel_t *__p;
  bool bVar7;
  ulong uVar8;
  reference source_format_00;
  type list_data_00;
  long lVar9;
  Vector *source_v_00;
  SelectionVector *pSVar10;
  idx_t child_i;
  ulong uVar11;
  long lVar12;
  idx_t row_idx;
  long lVar13;
  idx_t i;
  idx_t iVar14;
  uint64_t uVar15;
  ulong uVar16;
  idx_t child_i_1;
  idx_t row_idx_00;
  ulong uVar17;
  uint64_t local_d0;
  SelectionVector combined_sel;
  SelectionVector child_list_sel;
  SelectionVector list_sel;
  
  SelectionVector::SelectionVector(&list_sel,list_data->sel);
  pdVar2 = list_data->data;
  SelectionVector::SelectionVector(&child_list_sel,(source_format->unified).sel);
  pdVar3 = (source_format->unified).data;
  this_00 = &(source_format->unified).validity;
  pdVar4 = heap_sizes_v->data;
  uVar16 = 0;
  for (iVar14 = 0; iVar14 != append_count; iVar14 = iVar14 + 1) {
    row_idx = iVar14;
    if (append_sel->sel_vector != (sel_t *)0x0) {
      row_idx = (idx_t)append_sel->sel_vector[iVar14];
    }
    if (list_sel.sel_vector != (sel_t *)0x0) {
      row_idx = (idx_t)list_sel.sel_vector[row_idx];
    }
    bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(list_data->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    if (bVar7) {
      uVar8 = *(ulong *)(pdVar2 + row_idx * 0x10 + 8);
      if (uVar8 != 0) {
        for (uVar11 = 0; uVar11 < uVar8; uVar11 = uVar11 + 1) {
          row_idx_00 = *(long *)(pdVar2 + row_idx * 0x10) + uVar11;
          if (child_list_sel.sel_vector != (sel_t *)0x0) {
            row_idx_00 = (idx_t)child_list_sel.sel_vector[row_idx_00];
          }
          bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (&this_00->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
          if (bVar7) {
            uVar16 = uVar16 + *(long *)(pdVar3 + row_idx_00 * 0x10 + 8);
          }
          uVar8 = *(ulong *)((long)(pdVar2 + row_idx * 0x10) + 8);
        }
      }
    }
  }
  if ((source_v->type).physical_type_ == LIST) {
    uVar8 = ListVector::GetListSize(source_v);
  }
  else {
    uVar8 = ArrayVector::GetTotalSize(source_v);
  }
  if (uVar8 < uVar16) {
    uVar8 = uVar16;
  }
  source_format_00 =
       vector<duckdb::TupleDataVectorFormat,_true>::get<true>(&source_format->children,0);
  if ((source_format_00->combined_list_data).
      super_unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::CombinedListData_*,_std::default_delete<duckdb::CombinedListData>_>
      .super__Head_base<0UL,_duckdb::CombinedListData_*,_false>._M_head_impl ==
      (CombinedListData *)0x0) {
    make_uniq<duckdb::CombinedListData>();
    __p = combined_sel.sel_vector;
    combined_sel.sel_vector = (sel_t *)0x0;
    ::std::__uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
    ::reset((__uniq_ptr_impl<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
             *)&source_format_00->combined_list_data,(pointer)__p);
    ::std::unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>::
    ~unique_ptr((unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>_>
                 *)&combined_sel);
  }
  list_data_00 = unique_ptr<duckdb::CombinedListData,_std::default_delete<duckdb::CombinedListData>,_true>
                 ::operator*(&source_format_00->combined_list_data);
  SelectionVector::SelectionVector(&combined_sel,uVar8);
  for (iVar14 = 0; uVar8 != iVar14; iVar14 = iVar14 + 1) {
    combined_sel.sel_vector[iVar14] = 0;
  }
  this = &list_data_00->combined_validity;
  TemplatedValidityMask<unsigned_long>::SetAllValid
            (&this->super_TemplatedValidityMask<unsigned_long>,0x800);
  local_d0 = 0;
  for (uVar16 = 0; uVar16 != append_count; uVar16 = uVar16 + 1) {
    uVar11 = uVar16;
    if (append_sel->sel_vector != (sel_t *)0x0) {
      uVar11 = (ulong)append_sel->sel_vector[uVar16];
    }
    uVar17 = uVar11;
    if (list_sel.sel_vector != (sel_t *)0x0) {
      uVar17 = (ulong)list_sel.sel_vector[uVar11];
    }
    bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(list_data->validity).super_TemplatedValidityMask<unsigned_long>,uVar17);
    if (bVar7) {
      lVar13 = uVar17 * 0x10;
      lVar9 = (*(long *)(pdVar2 + lVar13 + 8) + 7U >> 3) + *(long *)(pdVar4 + uVar16 * 8);
      *(long *)(pdVar4 + uVar16 * 8) = lVar9;
      *(long *)(pdVar4 + uVar16 * 8) = lVar9 + *(long *)(pdVar2 + lVar13 + 8) * 8;
      uVar15 = 0;
      for (uVar17 = 0; uVar17 < *(ulong *)((long)(pdVar2 + lVar13) + 8); uVar17 = uVar17 + 1) {
        iVar14 = *(long *)(pdVar2 + lVar13) + uVar17;
        if (child_list_sel.sel_vector != (sel_t *)0x0) {
          iVar14 = (idx_t)child_list_sel.sel_vector[iVar14];
        }
        bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&this_00->super_TemplatedValidityMask<unsigned_long>,iVar14);
        if (bVar7) {
          lVar9 = *(long *)(pdVar3 + iVar14 * 0x10 + 8);
          if (lVar9 != 0) {
            uVar5 = *(undefined8 *)(pdVar3 + iVar14 * 0x10);
            for (lVar12 = 0; lVar9 != lVar12; lVar12 = lVar12 + 1) {
              combined_sel.sel_vector[local_d0 + uVar15 + lVar12] = (int)uVar5 + (int)lVar12;
            }
            uVar15 = uVar15 + lVar9;
          }
        }
      }
      list_data_00->combined_list_entries[uVar11].offset = local_d0;
      list_data_00->combined_list_entries[uVar11].length = uVar15;
      local_d0 = local_d0 + uVar15;
    }
    else {
      bVar6 = (byte)uVar11 & 0x3f;
      puVar1 = (this->super_TemplatedValidityMask<unsigned_long>).validity_mask + (uVar11 >> 6);
      *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
    }
  }
  if ((source_v->type).physical_type_ == LIST) {
    source_v_00 = ListVector::GetEntry(source_v);
  }
  else {
    source_v_00 = ArrayVector::GetEntry(source_v);
  }
  ApplySliceRecursive(source_v_00,source_format_00,&combined_sel,uVar8);
  pSVar10 = FlatVector::IncrementalSelectionVector();
  (list_data_00->combined_data).sel = pSVar10;
  (list_data_00->combined_data).data = (data_ptr_t)list_data_00->combined_list_entries;
  TemplatedValidityMask<unsigned_long>::Initialize
            (&(list_data_00->combined_data).validity.super_TemplatedValidityMask<unsigned_long>,
             &this->super_TemplatedValidityMask<unsigned_long>);
  WithinCollectionComputeHeapSizes
            (heap_sizes_v,source_v_00,source_format_00,append_sel,append_count,
             &list_data_00->combined_data);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&combined_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child_list_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&list_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void TupleDataCollection::CollectionWithinCollectionComputeHeapSizes(Vector &heap_sizes_v, const Vector &source_v,
                                                                     TupleDataVectorFormat &source_format,
                                                                     const SelectionVector &append_sel,
                                                                     const idx_t append_count,
                                                                     const UnifiedVectorFormat &list_data) {
	// Parent list data
	const auto list_sel = *list_data.sel;
	const auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(list_data);
	const auto &list_validity = list_data.validity;

	// Source
	const auto &child_list_data = source_format.unified;
	const auto child_list_sel = *child_list_data.sel;
	const auto child_list_entries = UnifiedVectorFormat::GetData<list_entry_t>(child_list_data);
	const auto &child_list_validity = child_list_data.validity;

	// Target
	auto heap_sizes = FlatVector::GetData<idx_t>(heap_sizes_v);

	// Figure out actual child list size (can differ from ListVector::GetListSize if dict/const vector),
	// and we cannot use ConstantVector::ZeroSelectionVector because it may need to be longer than STANDARD_VECTOR_SIZE
	idx_t sum_of_sizes = 0;
	for (idx_t i = 0; i < append_count; i++) {
		const auto list_idx = list_sel.get_index(append_sel.get_index(i));
		if (!list_validity.RowIsValid(list_idx)) {
			continue;
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;
		if (list_length == 0) {
			continue;
		}

		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_list_idx = child_list_sel.get_index(list_offset + child_i);
			if (!child_list_validity.RowIsValid(child_list_idx)) {
				continue;
			}

			const auto &child_list_entry = child_list_entries[child_list_idx];
			const auto &child_list_length = child_list_entry.length;

			sum_of_sizes += child_list_length;
		}
	}

	const auto child_list_child_count = MaxValue<idx_t>(
	    sum_of_sizes, source_v.GetType().InternalType() == PhysicalType::LIST ? ListVector::GetListSize(source_v)
	                                                                          : ArrayVector::GetTotalSize(source_v));

	D_ASSERT(source_format.children.size() == 1);
	auto &child_format = source_format.children[0];
#ifdef DEBUG
	// In debug mode this should be deleted by ResetCombinedListData
	D_ASSERT(!child_format.combined_list_data);
#endif
	if (!child_format.combined_list_data) {
		child_format.combined_list_data = make_uniq<CombinedListData>();
	}
	auto &combined_list_data = *child_format.combined_list_data;

	// Construct combined list entries and a selection/validity vector for the child list child
	SelectionVector combined_sel(child_list_child_count);
	for (idx_t i = 0; i < child_list_child_count; i++) {
		combined_sel.set_index(i, 0);
	}
	auto &combined_list_entries = combined_list_data.combined_list_entries;
	auto &combined_validity = combined_list_data.combined_validity;
	combined_validity.SetAllValid(STANDARD_VECTOR_SIZE);

	idx_t combined_list_offset = 0;
	for (idx_t i = 0; i < append_count; i++) {
		const auto append_idx = append_sel.get_index(i);
		const auto list_idx = list_sel.get_index(append_idx);
		if (!list_validity.RowIsValid(list_idx)) {
			combined_validity.SetInvalidUnsafe(append_idx);
			continue; // Original list entry is invalid - no need to serialize the child list
		}

		// Get the current list entry
		const auto &list_entry = list_entries[list_idx];
		const auto &list_offset = list_entry.offset;
		const auto &list_length = list_entry.length;

		// Size is the validity mask and the list sizes
		auto &heap_size = heap_sizes[i];
		heap_size += ValidityBytes::SizeInBytes(list_length);
		heap_size += list_length * sizeof(uint64_t);

		idx_t child_list_size = 0;
		for (idx_t child_i = 0; child_i < list_length; child_i++) {
			const auto child_list_idx = child_list_sel.get_index(list_offset + child_i);
			if (child_list_validity.RowIsValid(child_list_idx)) {
				const auto &child_list_entry = child_list_entries[child_list_idx];
				const auto &child_list_offset = child_list_entry.offset;
				const auto &child_list_length = child_list_entry.length;
				if (child_list_length == 0) {
					continue;
				}

				// Add this child's list entries to the combined selection vector
				for (idx_t child_value_i = 0; child_value_i < child_list_length; child_value_i++) {
					auto idx = combined_list_offset + child_list_size + child_value_i;
					auto loc = child_list_offset + child_value_i;
					combined_sel.set_index(idx, loc);
				}

				child_list_size += child_list_length;
			}
		}

		// Combine the child list entries into one
		auto &combined_list_entry = combined_list_entries[append_idx];
		combined_list_entry.offset = combined_list_offset;
		combined_list_entry.length = child_list_size;
		combined_list_offset += child_list_size;
	}

	// TODO: Template this?
	auto &child_source = source_v.GetType().InternalType() == PhysicalType::LIST ? ListVector::GetEntry(source_v)
	                                                                             : ArrayVector::GetEntry(source_v);
	ApplySliceRecursive(child_source, child_format, combined_sel, child_list_child_count);

	// Create a combined child_list_data to be used as list_data in the recursion
	auto &combined_child_list_data = combined_list_data.combined_data;
	combined_child_list_data.sel = FlatVector::IncrementalSelectionVector();
	combined_child_list_data.data = data_ptr_cast(combined_list_entries);
	combined_child_list_data.validity.Initialize(combined_validity);

	// Recurse
	WithinCollectionComputeHeapSizes(heap_sizes_v, child_source, child_format, append_sel, append_count,
	                                 combined_child_list_data);
}